

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwSetWindowSize(GLFWwindow *handle,int width,int height)

{
  undefined8 in_RAX;
  undefined4 in_register_00000014;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                  ,0x26e,"void glfwSetWindowSize(GLFWwindow *, int, int)");
  }
  if (width < 0) {
    __assert_fail("width >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                  ,0x26f,"void glfwSetWindowSize(GLFWwindow *, int, int)");
  }
  if (height < 0) {
    __assert_fail("height >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                  ,0x270,"void glfwSetWindowSize(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized != 0) {
    *(int *)(handle + 0x34) = width;
    *(int *)(handle + 0x38) = height;
    (*_glfw.platform.setWindowSize)((_GLFWwindow *)handle,width,height);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0,CONCAT44(in_register_00000014,height),in_RAX);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowSize(GLFWwindow* handle, int width, int height)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT();

    window->videoMode.width  = width;
    window->videoMode.height = height;

    _glfw.platform.setWindowSize(window, width, height);
}